

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

bool __thiscall iDynTree::SpatialInertia::isPhysicallyConsistent(SpatialInertia *this)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pSVar3;
  RotationalInertia inertiaAtCOM;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> eigenValuesSolver;
  RotationalInertia *local_100 [2];
  RotationalInertia local_f0;
  SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,0,3,3>> local_a8 [72];
  double local_60;
  double dStack_58;
  double local_50;
  undefined4 local_28;
  undefined2 local_24;
  
  if (0.0 < this->m_mass) {
    getRotationalInertiaWrtCenterOfMass(&local_f0,this);
    local_28 = 3;
    local_24 = 0;
    local_100[0] = &local_f0;
    pSVar3 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,0,3,3>>::
             compute<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
                       (local_a8,(EigenBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)local_100,0x80);
    auVar1._8_8_ = -(ulong)(0.0 <= ((local_60 + dStack_58) - local_50) * 0.5);
    auVar1._0_8_ = -(ulong)(0.0 <= ((local_50 + local_60) - dStack_58) * 0.5);
    uVar2 = movmskpd((int)pSVar3,auVar1);
    return (bool)(((byte)uVar2 & 2) >> 1 &
                 0.0 <= ((dStack_58 + local_50) - local_60) * 0.5 & (byte)uVar2);
  }
  return false;
}

Assistant:

bool SpatialInertia::isPhysicallyConsistent() const
{
    using namespace Eigen;

    bool isConsistent = true;

    // check that the mass is positive
    if( this->m_mass <= 0 )
    {
        isConsistent = false;
        return isConsistent;
    }

    // We get the inertia at the COM
    RotationalInertia inertiaAtCOM = this->getRotationalInertiaWrtCenterOfMass();

    // We get the inertia at the principal axis using eigen
    SelfAdjointEigenSolver<Matrix<double,3,3,RowMajor> > eigenValuesSolver;

    // We check both the positive definitiveness of the matrix and the triangle
    // inequality by directly checking the central second moment of mass of the rigid body
    // In a nutshell, we have that:
    // Ixx = Cyy + Czz
    // Iyy = Cxx + Czz
    // Izz = Cxx + Cyy
    // so
    // Cxx = (Iyy + Izz - Ixx)/2
    // Cyy = (Ixx + Izz - Iyy)/2
    // Czz = (Ixx + Iyy - Izz)/2
    // Then all the condition boils down to:
    // Cxx >= 0 , Cyy >= 0 , Czz >= 0
    eigenValuesSolver.compute( toEigen(inertiaAtCOM) );

    double Ixx = eigenValuesSolver.eigenvalues()(0);
    double Iyy = eigenValuesSolver.eigenvalues()(1);
    double Izz = eigenValuesSolver.eigenvalues()(2);

    double Cxx = (Iyy + Izz - Ixx)/2;
    double Cyy = (Ixx + Izz - Iyy)/2;
    double Czz = (Ixx + Iyy - Izz)/2;

    // We are accepting the configuration where C** is zero
    // so that we don't mark a point mass as physically inconsistent
    if( Cxx < 0 ||
        Cyy < 0 ||
        Czz < 0 )
    {
        isConsistent = false;
    }

    return isConsistent;
}